

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeletal_mesh.h
# Opt level: O0

bool __thiscall SkeletalMesh::Material::setDiffuse(Material *this,string *_name,string *_filename)

{
  Texture *pTVar1;
  string local_60;
  string local_40;
  string *local_20;
  string *_filename_local;
  string *_name_local;
  Material *this_local;
  
  local_20 = _filename;
  _filename_local = _name;
  _name_local = (string *)this;
  std::__cxx11::string::string((string *)&local_40,(string *)_name);
  std::__cxx11::string::string((string *)&local_60,(string *)_filename);
  pTVar1 = TextureImage::Texture::loadTexture(&local_40,&local_60);
  this->diffuse = pTVar1;
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return pTVar1 != (Texture *)TextureImage::Texture::error;
}

Assistant:

bool setDiffuse(std::string _name, std::string _filename = std::string()) {
            return (diffuse = &TextureImage::Texture::loadTexture(_name, _filename))
                   != &TextureImage::Texture::error;
        }